

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# undo_dialog_box.cpp
# Opt level: O1

void am_delete_script_commands_proc(Am_Object *cmd)

{
  Am_Slot_Key AVar1;
  bool bVar2;
  Am_Value *pAVar3;
  Am_Wrapper *pAVar4;
  int value;
  Am_Object execute_command;
  Am_Object script_window;
  Am_Object found_sel;
  Am_Object this_cmd;
  Am_Object scroll_menu;
  Am_Value_List sel_list;
  Am_Value_List new_cmd_list;
  Am_Value_List orig_cmds;
  Am_Value_List new_original_command_list;
  Am_Value_List original_command_list;
  Am_Object AStack_a8;
  Am_Object local_a0;
  Am_Object local_98;
  Am_Object local_90;
  Am_Object local_88;
  Am_Value_List local_80;
  Am_Value_List local_70;
  Am_Value_List local_60;
  Am_Value_List local_50;
  Am_Value_List local_40;
  
  Am_Object::Get_Object((Am_Object *)&local_80,(Am_Slot_Key)cmd,0x170);
  Am_Object::Get_Object(&local_a0,(Am_Slot_Key)&local_80,10);
  Am_Object::~Am_Object((Am_Object *)&local_80);
  pAVar3 = Am_Object::Get(&local_a0,Am_UNDO_SCROLL_GROUP,0);
  Am_Object::Am_Object(&local_88,pAVar3);
  pAVar3 = Am_Object::Get(&local_88,0x169,0);
  Am_Value_List::Am_Value_List(&local_80,pAVar3);
  pAVar3 = Am_Object::Get(&local_a0,Am_SCRIPT_EXECUTE_COMMAND,0);
  Am_Object::Am_Object(&AStack_a8,pAVar3);
  pAVar3 = Am_Object::Get(&AStack_a8,Am_COMMANDS_PROTOTYPES,0);
  Am_Value_List::Am_Value_List(&local_60,pAVar3);
  pAVar3 = Am_Object::Get(&AStack_a8,Am_ORIGINAL_COMMAND_LIST,0);
  Am_Value_List::Am_Value_List(&local_40,pAVar3);
  pAVar4 = Am_Value_List::operator_cast_to_Am_Wrapper_(&local_60);
  Am_Object::Set(cmd,0x16c,pAVar4,0);
  AVar1 = Am_ORIGINAL_COMMAND_LIST;
  pAVar4 = Am_Value_List::operator_cast_to_Am_Wrapper_(&local_40);
  Am_Object::Set(cmd,AVar1,pAVar4,0);
  local_90.data = (Am_Object_Data *)0x0;
  local_98.data = (Am_Object_Data *)0x0;
  Am_Value_List::Am_Value_List(&local_70);
  Am_Value_List::Am_Value_List(&local_50);
  Am_Value_List::Start(&local_60);
  value = 1;
  while( true ) {
    bVar2 = Am_Value_List::Last(&local_60);
    AVar1 = Am_COMMANDS_PROTOTYPES;
    if (bVar2) break;
    pAVar3 = Am_Value_List::Get(&local_60);
    Am_Object::operator=(&local_90,pAVar3);
    bVar2 = am_find_cmd_in_sel(&local_80,&local_90,&local_98);
    if (!bVar2) {
      pAVar4 = Am_Object::operator_cast_to_Am_Wrapper_(&local_90);
      Am_Value_List::Add(&local_70,pAVar4,Am_TAIL,true);
      pAVar3 = Am_Object::Get(&local_90,0xc,0);
      Am_Value_List::Add(&local_50,pAVar3,Am_TAIL,true);
      Am_Object::Set(&local_90,Am_COMMAND_INDEX_IN_SCRIPT,value,1);
      value = value + 1;
    }
    Am_Value_List::Next(&local_60);
  }
  pAVar4 = Am_Value_List::operator_cast_to_Am_Wrapper_(&local_70);
  Am_Object::Set(&AStack_a8,AVar1,pAVar4,0);
  AVar1 = Am_COMMANDS_IN_SCRIPT;
  pAVar4 = Am_Value_List::operator_cast_to_Am_Wrapper_(&local_70);
  Am_Object::Set(&AStack_a8,AVar1,pAVar4,0);
  AVar1 = Am_ORIGINAL_COMMAND_LIST;
  pAVar4 = Am_Value_List::operator_cast_to_Am_Wrapper_(&local_50);
  Am_Object::Set(&AStack_a8,AVar1,pAVar4,0);
  am_set_commands_into_script_window(&local_a0,&AStack_a8);
  Am_Value_List::~Am_Value_List(&local_50);
  Am_Value_List::~Am_Value_List(&local_70);
  Am_Object::~Am_Object(&local_98);
  Am_Object::~Am_Object(&local_90);
  Am_Value_List::~Am_Value_List(&local_40);
  Am_Value_List::~Am_Value_List(&local_60);
  Am_Object::~Am_Object(&AStack_a8);
  Am_Value_List::~Am_Value_List(&local_80);
  Am_Object::~Am_Object(&local_88);
  Am_Object::~Am_Object(&local_a0);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, am_delete_script_commands,
                 (Am_Object cmd))
{
  // *** SHOULD FIX UP REFERENCES TO THE DELETED COMMANDS
  // *** PLACEHOLDERS SET BY THESE COMMANDS
  Am_Object script_window = cmd.Get_Object(Am_SAVED_OLD_OWNER).Get_Owner();
  Am_Object scroll_menu = script_window.Get(Am_UNDO_SCROLL_GROUP);
  Am_Value_List sel_list = scroll_menu.Get(Am_VALUE);
  Am_Object execute_command = script_window.Get(Am_SCRIPT_EXECUTE_COMMAND);
  Am_Value_List orig_cmds = execute_command.Get(Am_COMMANDS_PROTOTYPES);
  Am_Value_List original_command_list =
      execute_command.Get(Am_ORIGINAL_COMMAND_LIST);

  cmd.Set(Am_OLD_VALUE, orig_cmds);
  cmd.Set(Am_ORIGINAL_COMMAND_LIST, original_command_list);

  Am_Object this_cmd, found_sel;
  Am_Value_List new_cmd_list, new_original_command_list;
  int i = 1;
  for (orig_cmds.Start(); !orig_cmds.Last(); orig_cmds.Next()) {
    this_cmd = orig_cmds.Get();
    if (!am_find_cmd_in_sel(sel_list, this_cmd, found_sel)) {
      new_cmd_list.Add(this_cmd);
      new_original_command_list.Add(this_cmd.Get(Am_SOURCE_OF_COPY));
      this_cmd.Set(Am_COMMAND_INDEX_IN_SCRIPT, i++, Am_OK_IF_NOT_THERE);
    }
  }
  execute_command.Set(Am_COMMANDS_PROTOTYPES, new_cmd_list);
  execute_command.Set(Am_COMMANDS_IN_SCRIPT, new_cmd_list);
  execute_command.Set(Am_ORIGINAL_COMMAND_LIST, new_original_command_list);

  am_set_commands_into_script_window(script_window, execute_command);
}